

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
BuildTokenTestCompleteThreeStepsSerial::Run(BuildTokenTestCompleteThreeStepsSerial *this)

{
  Builder *this_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  string err;
  string local_70;
  string local_50;
  
  pTVar1 = g_current_test;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"cat12","");
  this_00 = &(this->super_BuildTokenTest).super_BuildTest.builder_;
  pNVar4 = Builder::AddTarget(this_00,&local_50,&local_70);
  testing::Test::Check
            (pTVar1,pNVar4 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10ca,"builder_.AddTarget(\"cat12\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar3 == 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x10cb,"\"\" == err");
  if (!bVar2) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00147a1e;
  }
  BuildTokenTest::ExpectCanRunMore(&this->super_BuildTokenTest,4,1,1,1,1);
  BuildTokenTest::ExpectAcquireToken(&this->super_BuildTokenTest,4,1,0,1,1);
  BuildTokenTest::ExpectWaitForCommand(&this->super_BuildTokenTest,3,1,0,0);
  pTVar1 = g_current_test;
  bVar2 = Builder::Build(this_00,&local_70);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10d3,"builder_.Build(&err)");
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10d4,"\"\" == err");
  testing::Test::Check
            (g_current_test,
             (long)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 0x60,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10d6,"3u == token_command_runner_.commands_ran_.size()");
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare
                    ((char *)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar3 == 0) {
    iVar3 = std::__cxx11::string::compare
                      ((char *)((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 != 0) goto LAB_0014797e;
    bVar2 = true;
  }
  else {
LAB_0014797e:
    iVar3 = std::__cxx11::string::compare
                      ((char *)(this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar3 == 0) {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
      bVar2 = iVar3 == 0;
    }
    else {
      bVar2 = false;
    }
  }
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10da,
             "(token_command_runner_.commands_ran_[0] == \"cat in1 > cat1\" && token_command_runner_.commands_ran_[1] == \"cat in1 in2 > cat2\") || (token_command_runner_.commands_ran_[0] == \"cat in1 in2 > cat2\" && token_command_runner_.commands_ran_[1] == \"cat in1 > cat1\" )"
            );
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare
                    ((char *)((this->super_BuildTokenTest).token_command_runner_.commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2));
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x10db,"token_command_runner_.commands_ran_[2] == \"cat cat1 cat2 > cat12\"");
LAB_00147a1e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTokenTest, CompleteThreeStepsSerial) {
  // plan should execute more than one command
  string err;
  EXPECT_TRUE(builder_.AddTarget("cat12", &err));
  ASSERT_EQ("", err);

  // allow running of all commands
  ExpectCanRunMore(4,     true, true,  true,  true);
  ExpectAcquireToken(4,   true, false, true,  true);
  // wait for commands to finalize
  ExpectWaitForCommand(3, true, false, false);

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);

  EXPECT_EQ(3u, token_command_runner_.commands_ran_.size());
  EXPECT_TRUE((token_command_runner_.commands_ran_[0] == "cat in1 > cat1"     &&
               token_command_runner_.commands_ran_[1] == "cat in1 in2 > cat2") ||
              (token_command_runner_.commands_ran_[0] == "cat in1 in2 > cat2" &&
               token_command_runner_.commands_ran_[1] == "cat in1 > cat1"    ));
  EXPECT_TRUE(token_command_runner_.commands_ran_[2] == "cat cat1 cat2 > cat12");
}